

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

S2CellUnion * __thiscall
S2CellUnion::Intersection(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  bool bVar1;
  ostream *poVar2;
  byte local_6c;
  byte local_6a;
  S2LogMessage local_48;
  S2LogMessageVoidify local_35 [20];
  undefined1 local_21;
  S2CellUnion *local_20;
  S2CellUnion *y_local;
  S2CellUnion *this_local;
  S2CellUnion *result;
  
  local_21 = 0;
  local_20 = y;
  y_local = this;
  this_local = __return_storage_ptr__;
  S2CellUnion(__return_storage_ptr__);
  GetIntersection(&this->cell_ids_,&local_20->cell_ids_,&__return_storage_ptr__->cell_ids_);
  bVar1 = IsNormalized(__return_storage_ptr__);
  local_6a = 1;
  if (!bVar1) {
    bVar1 = IsNormalized(this);
    local_6c = 0;
    if (!bVar1) {
      bVar1 = IsNormalized(local_20);
      local_6c = bVar1 ^ 0xff;
    }
    local_6a = local_6c;
  }
  if (((local_6a ^ 0xff) & 1) == 0) {
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_union.cc"
             ,0x142,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_48);
  poVar2 = std::operator<<(poVar2,
                           "Check failed: result.IsNormalized() || (!IsNormalized() && !y.IsNormalized()) "
                          );
  S2LogMessageVoidify::operator&(local_35,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

S2CellUnion S2CellUnion::Intersection(const S2CellUnion& y) const {
  S2CellUnion result;
  GetIntersection(cell_ids_, y.cell_ids_, &result.cell_ids_);
  // The output is normalized as long as at least one input is normalized.
  S2_DCHECK(result.IsNormalized() || (!IsNormalized() && !y.IsNormalized()));
  return result;
}